

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelTransformers.cpp
# Opt level: O0

void iDynTree::buildLinkToAdditionalFramesList
               (Model *fullModel,
               vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
               *link2additionalFramesAdjacencyList)

{
  Model *this;
  size_t sVar1;
  vector<long,_std::allocator<long>_> *this_00;
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  *in_RSI;
  LinkIndex linkOfAdditionalFrame;
  FrameIndex additionalFrame;
  FrameIndex in_stack_000001c0;
  Model *in_stack_000001c8;
  size_type in_stack_ffffffffffffffe8;
  Model *pMVar2;
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  *this_01;
  
  this_01 = in_RSI;
  Model::getNrOfLinks((Model *)0x458992);
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::resize(this_01,in_stack_ffffffffffffffe8);
  this = (Model *)Model::getNrOfLinks((Model *)0x4589a9);
  while( true ) {
    pMVar2 = this;
    sVar1 = Model::getNrOfFrames(this);
    if ((long)sVar1 <= (long)this) break;
    this_00 = (vector<long,_std::allocator<long>_> *)
              Model::getFrameLink(in_stack_000001c8,in_stack_000001c0);
    std::
    vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
    ::operator[](this_01,(size_type)this_00);
    std::vector<long,_std::allocator<long>_>::push_back(this_00,(value_type_conflict2 *)in_RSI);
    this = (Model *)((long)&pMVar2->_vptr_Model + 1);
  }
  return;
}

Assistant:

void buildLinkToAdditionalFramesList(const Model& fullModel,
                                     std::vector< std::vector<FrameIndex> > & link2additionalFramesAdjacencyList)
{
    // Resize the data structure
    link2additionalFramesAdjacencyList.resize(fullModel.getNrOfLinks());

    // Iterate on all the frames and add them to the right link list
    for(FrameIndex additionalFrame = fullModel.getNrOfLinks();
        additionalFrame < (FrameIndex)fullModel.getNrOfFrames();
        additionalFrame++)
    {
        LinkIndex linkOfAdditionalFrame = fullModel.getFrameLink(additionalFrame);
        link2additionalFramesAdjacencyList[linkOfAdditionalFrame].push_back(additionalFrame);
    }
}